

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

bool density_tests::detail::
     PutUInt8<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  uint uVar2;
  ElementType val;
  uchar local_1a [2];
  runtime_type<> type;
  
  iVar1 = EasyRandom::get_bool(i_rand,0.9);
  if (iVar1 == 0) {
    val = '\b';
    type.m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_char>
         ::s_table;
    uVar2 = EasyRandom::get_int<unsigned_int>(i_rand,0,3);
    switch(uVar2) {
    case 0:
      density::
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
      dyn_push_copy((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                     *)queue,&type,&val);
      break;
    case 1:
      density::
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
      dyn_push_move((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                     *)queue,&type,&val);
      break;
    case 2:
      density::
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
      reentrant_dyn_push_copy
                ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                  *)queue,&type,&val);
      break;
    case 3:
      density::
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
      reentrant_dyn_push_move
                ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                  *)queue,&type,&val);
    }
  }
  else {
    iVar1 = EasyRandom::get_bool(i_rand);
    if (iVar1 == 0) {
      local_1a[0] = '\b';
      density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
      ::reentrant_emplace<unsigned_char,unsigned_char>
                ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                  *)queue,local_1a);
    }
    else {
      local_1a[1] = 8;
      density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
      ::emplace<unsigned_char,unsigned_char>
                ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                  *)queue,local_1a + 1);
    }
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    if (i_rand.get_bool())
                        queue.template emplace<uint8_t>(static_cast<uint8_t>(8));
                    else
                        queue.template reentrant_emplace<uint8_t>(static_cast<uint8_t>(8));
                }
                else
                {
                    ElementType val  = 8;
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    switch (i_rand.get_int<unsigned>(0, 3))
                    {
                    case 0:
                        queue.dyn_push_copy(type, &val);
                        break;
                    case 1:
                        queue.dyn_push_move(type, &val);
                        break;
                    case 2:
                        queue.reentrant_dyn_push_copy(type, &val);
                        break;
                    case 3:
                        queue.reentrant_dyn_push_move(type, &val);
                        break;
                    }
                }
                return true;
            }